

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::SymbolicSchema::SymbolicSchema(SymbolicSchema *this,Name *name,NodePtr *link)

{
  NodeSymbolic *this_00;
  NodePtr local_78;
  Name local_68;
  
  this_00 = (NodeSymbolic *)operator_new(0x68);
  Name::Name(&local_68,name);
  local_78.px = link->px;
  local_78.pn.pi_ = (link->pn).pi_;
  if (local_78.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_78.pn.pi_)->use_count_ = (local_78.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  NodeSymbolic::NodeSymbolic(this_00,(HasName *)&local_68,&local_78);
  Schema::Schema(&this->super_Schema,(Node *)this_00);
  boost::detail::shared_count::~shared_count(&local_78.pn);
  Name::~Name(&local_68);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001915d0;
  return;
}

Assistant:

SymbolicSchema::SymbolicSchema(const Name &name, const NodePtr& link) :
    Schema(new NodeSymbolic(HasName(name), link))
{
}